

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

bool __thiscall
tinyusdz::Attribute::get<tinyusdz::value::vector3f>
          (Attribute *this,double t,vector3f *dst,TimeSampleInterpolationType tinterp)

{
  float fVar1;
  bool bVar2;
  value_type *pvVar3;
  optional<tinyusdz::value::vector3f> local_58;
  undefined1 local_48 [8];
  optional<tinyusdz::value::vector3f> v;
  TimeSampleInterpolationType tinterp_local;
  vector3f *dst_local;
  double t_local;
  Attribute *this_local;
  
  if (dst == (vector3f *)0x0) {
    this_local._7_1_ = 0;
  }
  else {
    tinyusdz::value::TimeCode::TimeCode((TimeCode *)((long)&v.contained + 4),t);
    bVar2 = tinyusdz::value::TimeCode::is_default((TimeCode *)((long)&v.contained + 4));
    if ((bVar2) && (bVar2 = has_value(this), bVar2)) {
      primvar::PrimVar::get_value<tinyusdz::value::vector3f>(&local_58,&this->_var);
      nonstd::optional_lite::optional<tinyusdz::value::vector3f>::
      optional<tinyusdz::value::vector3f,_0>
                ((optional<tinyusdz::value::vector3f> *)local_48,&local_58);
      nonstd::optional_lite::optional<tinyusdz::value::vector3f>::~optional(&local_58);
      bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_48);
      if (bVar2) {
        pvVar3 = nonstd::optional_lite::optional<tinyusdz::value::vector3f>::value
                           ((optional<tinyusdz::value::vector3f> *)local_48);
        fVar1 = pvVar3->y;
        dst->x = pvVar3->x;
        dst->y = fVar1;
        dst->z = pvVar3->z;
        this_local._7_1_ = 1;
      }
      nonstd::optional_lite::optional<tinyusdz::value::vector3f>::~optional
                ((optional<tinyusdz::value::vector3f> *)local_48);
      if (bVar2) goto LAB_007bf62e;
    }
    bVar2 = has_timesamples(this);
    if (bVar2) {
      this_local._7_1_ =
           primvar::PrimVar::get_interpolated_value<tinyusdz::value::vector3f>
                     (&this->_var,t,tinterp,dst);
    }
    else {
      this_local._7_1_ = get_value<tinyusdz::value::vector3f>(this,dst);
    }
  }
LAB_007bf62e:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool get(const double t, T *dst,
           value::TimeSampleInterpolationType tinterp =
           value::TimeSampleInterpolationType::Linear) const {
    if (!dst) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {
      if (has_value()) {
        nonstd::optional<T> v = _var.get_value<T>();
        if (v) {
          (*dst) = v.value();
          return true;
        }
      }
    }

    if (has_timesamples()) {
      return _var.get_interpolated_value(t, tinterp, dst);
    }

    // try to get 'defaut' value
    return get_value(dst);
  }